

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  long lVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  GCstr *pGVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  uint uVar17;
  GCstr *sx;
  long *plVar18;
  uint uVar19;
  bool bVar20;
  byte local_58;
  
  if (0x7ffffeff < lenx) {
    lj_err_msg(L,LJ_ERR_STROV);
  }
  plVar18 = (long *)(ulong)(L->glref).ptr32;
  uVar19 = (uint)lenx;
  if (uVar19 == 0) {
    return (GCstr *)(plVar18 + 0x1f);
  }
  uVar3 = lua_hash(str,uVar19);
  lVar1 = *plVar18;
  uVar9 = *(uint *)(plVar18 + 1);
  pGVar5 = (GCstr *)(ulong)*(uint *)(lVar1 + (ulong)(uVar9 & uVar3) * 4);
  uVar4 = (uVar19 + (int)str) - 1 & 0xfff;
  iVar11 = ((uint)(lenx >> 4) & 0xfffffff) + 1;
  if (uVar4 < 0xffd) {
    uVar10 = 0;
    for (; pGVar5 != (GCstr *)0x0; pGVar5 = (GCstr *)(ulong)(pGVar5->nextgc).gcptr32) {
      if ((pGVar5->hash == uVar3) && (pGVar5->len == uVar19)) {
        uVar10 = uVar10 + iVar11;
        uVar12 = 0;
        iVar6 = uVar19 * -8;
        while( true ) {
          iVar6 = iVar6 + 0x20;
          uVar7 = *(uint *)((long)&pGVar5[1].nextgc.gcptr32 + (ulong)uVar12);
          if (*(uint *)(str + uVar12) != uVar7) break;
          uVar12 = uVar12 + 4;
          if (uVar19 <= uVar12) goto LAB_00116f0f;
        }
        if ((-4 < (int)(uVar12 - uVar19)) &&
           ((uVar7 ^ *(uint *)(str + uVar12)) << ((byte)iVar6 & 0x1f) == 0)) {
LAB_00116f0f:
          if ((~*(byte *)(plVar18 + 0xb) & pGVar5->marked & 3) != 0) {
            pGVar5->marked = pGVar5->marked ^ 3;
          }
          plVar18[6] = plVar18[6] + 1;
          return pGVar5;
        }
      }
      uVar10 = uVar10 + 1;
    }
  }
  else {
    uVar10 = 0;
    for (; pGVar5 != (GCstr *)0x0; pGVar5 = (GCstr *)(ulong)(pGVar5->nextgc).gcptr32) {
      if ((pGVar5->hash == uVar3) && (pGVar5->len == uVar19)) {
        iVar6 = bcmp(str,pGVar5 + 1,lenx);
        if (iVar6 == 0) goto LAB_0011722b;
        uVar10 = uVar10 + iVar11;
      }
      uVar10 = uVar10 + 1;
    }
  }
  if (0xc < uVar19) {
    uVar2 = plVar18[2];
    uVar14 = 1L << (byte)(uVar3 >> 0x1a);
    if ((uVar2 >> (uVar3 >> 0x1a) & 1) == 0) {
      bVar20 = false;
    }
    else {
      bVar20 = ((ulong)plVar18[3] >> ((ulong)(uVar3 >> 0x14) & 0x3f) & 1) != 0;
    }
    if ((bVar20) || (0x28 < uVar10)) {
      uVar12 = 0xdeadbeef;
      uVar7 = 0xcafedead;
      uVar13 = 0;
      uVar17 = 0;
      puVar16 = (uint *)str;
      for (uVar15 = lenx & 0xffffffff; 8 < (uint)uVar15; uVar15 = uVar15 - 8) {
        uVar17 = uVar17 ^ *puVar16;
        uVar13 = uVar13 ^ puVar16[1];
        uVar7 = uVar7 + uVar17;
        iVar11 = uVar12 + uVar13;
        uVar17 = (uVar17 << 5 | uVar17 >> 0x1b) - iVar11;
        uVar13 = (uVar13 << 7 | uVar13 >> 0x19) - uVar7;
        uVar7 = (uVar7 * 0x1000000 | uVar7 >> 8) ^ uVar17;
        uVar12 = (iVar11 * 2 | (uint)(iVar11 < 0)) ^ uVar13;
        puVar16 = puVar16 + 2;
      }
      uVar17 = uVar17 ^ *(uint *)((long)puVar16 + (uVar15 - 8));
      uVar13 = uVar13 ^ *(uint *)((long)puVar16 + (uVar15 - 4));
      uVar8 = (uVar7 + uVar13) - (uVar17 << 9 | uVar17 >> 0x17);
      uVar12 = (uVar12 + uVar17) - (uVar13 << 0x12 | uVar13 >> 0xe);
      uVar7 = (uVar12 ^ uVar8) - (uVar8 * 0x2000000 | uVar8 >> 7);
      uVar13 = ((uVar12 * 0x2000 | uVar12 >> 0x13) +
                (uVar19 - ((uVar13 ^ uVar17) << 7 | (uVar13 ^ uVar17) >> 0x19)) + uVar8 ^ uVar7) -
               (uVar7 * 0x10000 | uVar7 >> 0x10);
      uVar12 = (uVar8 ^ uVar13) - (uVar13 * 0x10 | uVar13 >> 0x1c);
      uVar12 = (uVar7 ^ uVar12) - (uVar12 * 0x4000 | uVar12 >> 0x12);
      uVar12 = uVar3 & 0xfc000000 | (uVar13 ^ uVar12) - (uVar12 * 0x1000000 | uVar12 >> 8) >> 6;
      if (bVar20) {
        pGVar5 = (GCstr *)(ulong)*(uint *)(lVar1 + (ulong)(uVar9 & uVar12) * 4);
        if (uVar4 < 0xffd) {
          for (; pGVar5 != (GCstr *)0x0; pGVar5 = (GCstr *)(ulong)(pGVar5->nextgc).gcptr32) {
            if ((pGVar5->hash == uVar12) && (pGVar5->len == uVar19)) {
              uVar9 = 0;
              iVar11 = uVar19 * -8;
              while( true ) {
                iVar11 = iVar11 + 0x20;
                uVar4 = *(uint *)((long)&pGVar5[1].nextgc.gcptr32 + (ulong)uVar9);
                if (*(uint *)(str + uVar9) != uVar4) break;
                uVar9 = uVar9 + 4;
                if (uVar19 <= uVar9) goto LAB_0011722b;
              }
              if ((-4 < (int)(uVar9 - uVar19)) &&
                 ((uVar4 ^ *(uint *)(str + uVar9)) << ((byte)iVar11 & 0x1f) == 0)) {
LAB_0011722b:
                if ((~*(byte *)(plVar18 + 0xb) & pGVar5->marked & 3) != 0) {
                  pGVar5->marked = pGVar5->marked ^ 3;
                }
                plVar18[6] = plVar18[6] + 1;
                return pGVar5;
              }
            }
          }
        }
        else {
          for (; pGVar5 != (GCstr *)0x0; pGVar5 = (GCstr *)(ulong)(pGVar5->nextgc).gcptr32) {
            if (((pGVar5->hash == uVar12) && (pGVar5->len == uVar19)) &&
               (iVar11 = bcmp(str,pGVar5 + 1,lenx), iVar11 == 0)) goto LAB_0011722b;
          }
        }
      }
      if (uVar10 < 0x29) {
        local_58 = 0;
      }
      else {
        local_58 = (byte)(uVar3 >> 0x14);
        uVar15 = 1L << (local_58 & 0x3f);
        plVar18[2] = uVar2 | uVar14;
        plVar18[3] = plVar18[3] | uVar15;
        local_58 = local_58 | 0xc0;
        plVar18[4] = plVar18[4] | uVar14;
        plVar18[5] = plVar18[5] | uVar15;
        uVar3 = uVar12;
      }
      goto LAB_00116fe2;
    }
  }
  local_58 = 0;
LAB_00116fe2:
  plVar18[7] = plVar18[7] + 1;
  pGVar5 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,uVar19 + 0x11);
  pGVar5->marked = *(byte *)(plVar18 + 0xb) & 3;
  pGVar5->gct = '\x04';
  pGVar5->reserved = '\0';
  pGVar5->len = uVar19;
  pGVar5->hash = uVar3;
  pGVar5->strflags = local_58;
  memcpy(pGVar5 + 1,str,lenx);
  *(undefined1 *)((long)&pGVar5[1].nextgc.gcptr32 + lenx) = 0;
  uVar19 = *(uint *)(plVar18 + 1);
  lVar1 = *plVar18;
  (pGVar5->nextgc).gcptr32 = *(uint32_t *)(lVar1 + (ulong)(uVar3 & uVar19) * 4);
  *(int *)(lVar1 + (ulong)(uVar3 & uVar19) * 4) = (int)pGVar5;
  uVar19 = *(uint *)((long)plVar18 + 0xc);
  *(uint *)((long)plVar18 + 0xc) = uVar19 + 1;
  if (*(uint *)(plVar18 + 1) < uVar19) {
    lj_str_resize(L,*(uint *)(plVar18 + 1) * 2 + 1);
  }
  return pGVar5;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g;
  GCstr *s;
  GCobj *o;
  MSize len = (MSize)lenx;
  uint8_t strflags = 0;
#if LUAJIT_SMART_STRINGS
  unsigned collisions = 0;
#endif
  if (lenx >= LJ_MAX_STR)
    lj_err_msg(L, LJ_ERR_STROV);
  g = G(L);
  if (len == 0)
    return &g->strempty;
  /* Compute string hash. Constants taken from lookup3 hash by Bob Jenkins. */
  MSize h = lua_hash(str, len);
  /* Check if the string has already been interned. */
  o = gcref(g->strhash[h & g->strmask]);
#if LUAJIT_SMART_STRINGS
/*
** The default "fast" string hash function samples only a few positions
** in a string, the remaining bytes don't affect the function's result.
** The function performs well for short strings; however long strings
** can yield extremely high collision rates.
**
** An adaptive schema was implemented. Two hash functions are used
** simultaneously. A bucket is picked based on the output of the fast
** hash function. If an item is to be inserted in a collision chain
** longer than a certain threshold, another bucket is picked based on
** the stronger hash function. Since two hash functions are used
** simultaneously, insert should consider two buckets. The second bucket
** is often NOT considered thanks to the bloom filter. The filter is
** rebuilt during GC cycle.
**
** Parameters below were tuned on a set of benchmarks. Max_collisions is
** also backed by theory: the expected maximum length of a collision
** chain in a hash table with the fill factor of 1.0 is
** O(log(N)/log(log(N))), assuming uniformly distributed random keys.
** The upper bound for N=65,000 is 10, hence 40 is a clear indication of
** an anomaly.
**/
#define max_collisions 40
#define inc_collision_soft() (collisions++)
/* If different strings yield the same hash sum, grow counter faster. */
#define inc_collision_hard() (collisions+=1+(len>>4), 1)
#else
#define inc_collision_hard() (1)
#define inc_collision_soft()
#endif
  if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      str_fastcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  } else {  /* Slow path: end of string is too close to a page boundary. */
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      memcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  }
#if LUAJIT_SMART_STRINGS
  /* "Fast" hash function consumes all bytes of a string <= 12 bytes. */
  if (len > 12) {
    /*
    ** The bloom filter is keyed with the high 12 bits of the fast
    ** hash sum. The filter is rebuilt during GC cycle. It's beneficial
    ** to have these bits readily available and avoid hash sum
    ** recalculation during GC. High 6 bits are included in the "full"
    ** hash sum, and bits 19-25 are stored in s->strflags.
    **/
    int search_fullh =
       bloomtest(g->strbloom.cur[0], h>>(sizeof(h)*8- 6)) != 0 &&
       bloomtest(g->strbloom.cur[1], h>>(sizeof(h)*8-12)) != 0;
    if (LJ_UNLIKELY(search_fullh || collisions > max_collisions)) {
      MSize fh = lj_fullhash((const uint8_t*)str, len);
#define high6mask ((~(MSize)0)<<(sizeof(MSize)*8-6))
      fh = (fh >> 6) | (h & high6mask);
      if (search_fullh) {
	/* Recheck if the string has already been interned with "harder" hash. */
	o = gcref(g->strhash[fh & g->strmask]);
	if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && str_fastcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	} else {  /* Slow path: end of string is too close to a page boundary. */
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && memcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	}
      }
      if (collisions > max_collisions) {
	strflags = 0xc0 | ((h>>(sizeof(h)*8-12))&0x3f);
	bloomset(g->strbloom.cur[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.cur[1], h>>(sizeof(h)*8-12));
	bloomset(g->strbloom.next[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.next[1], h>>(sizeof(h)*8-12));
	h = fh;
      }
    }
  }
#endif
  g->strhash_miss++;
  /* Nope, create a new string. */
  s = lj_mem_newt(L, sizeof(GCstr)+len+1, GCstr);
  newwhite(g, s);
  s->gct = ~LJ_TSTR;
  s->len = len;
  s->hash = h;
  s->reserved = 0;
  s->strflags = strflags;
  memcpy(strdatawr(s), str, len);
  strdatawr(s)[len] = '\0';  /* Zero-terminate string. */
  /* Add it to string hash table. */
  h &= g->strmask;
  s->nextgc = g->strhash[h];
  /* NOBARRIER: The string table is a GC root. */
  setgcref(g->strhash[h], obj2gco(s));
  if (g->strnum++ > g->strmask)  /* Allow a 100% load factor. */
    lj_str_resize(L, (g->strmask<<1)+1);  /* Grow string table. */
  return s;  /* Return newly interned string. */
}